

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::Data::Reset(Data *this)

{
  DataChunk *pDVar1;
  DataChunk *pDVar2;
  
  this->currentOffset = 0;
  pDVar1 = this->head;
  pDVar2 = pDVar1;
  while (pDVar2 != (DataChunk *)0x0) {
    pDVar2->currentByte = pDVar2->buffer;
    pDVar2 = pDVar2->nextChunk;
  }
  this->current = pDVar1;
  return;
}

Assistant:

void ByteCodeWriter::Data::Reset()
    {
        currentOffset = 0;
        DataChunk* currentChunk = head;
        while (currentChunk)
        {
            // reset to the starting point
            currentChunk->Reset();
            currentChunk = currentChunk->nextChunk;
        }

        current = head;
    }